

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::assert_growing_inodes
          (tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,inode_type_counter_array *expected_growing_inode_counts)

{
  bool bVar1;
  char *message;
  array<unsigned_long,_4UL> *container;
  ElementsAreArrayMatcher<unsigned_long> *matcher;
  AssertHelper local_88;
  Message local_80;
  ElementsAreArrayMatcher<unsigned_long> local_78;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_> local_60
  ;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  inode_type_counter_array actual_growing_inode_counts;
  inode_type_counter_array *expected_growing_inode_counts_local;
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get_growing_inode_counts((inode_type_counter_array *)&gtest_ar.message_,&this->test_db);
  testing::ElementsAreArray<std::array<unsigned_long,4ul>>
            (&local_78,(testing *)expected_growing_inode_counts,container);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>
            (&local_60,(internal *)&local_78,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::
  operator()(local_48,(char *)&local_60,(array<unsigned_long,_4UL> *)"(actual_growing_inode_counts)"
            );
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_>::
  ~PredicateFormatterFromMatcher(&local_60);
  testing::internal::ElementsAreArrayMatcher<unsigned_long>::~ElementsAreArrayMatcher(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2c8,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  return;
}

Assistant:

constexpr void assert_growing_inodes(
      const inode_type_counter_array &expected_growing_inode_counts)
      const noexcept {
    const auto actual_growing_inode_counts = test_db.get_growing_inode_counts();
    UNODB_ASSERT_THAT(
        actual_growing_inode_counts,
        ::testing::ElementsAreArray(expected_growing_inode_counts));
  }